

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

destructive_iterator * __thiscall
google::
sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
::destructive_begin(sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                    *this)

{
  st_iterator it;
  st_iterator it_end;
  nonempty_iterator in_RSI;
  destructive_iterator *in_RDI;
  sparsetable<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff98;
  destructive_iterator *pdVar1;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_10;
  
  pdVar1 = in_RDI;
  sparsetable<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ::destructive_begin(in_stack_ffffffffffffff80);
  sparsetable<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ::destructive_end(in_stack_ffffffffffffff80);
  it.row_end._M_current =
       (sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
        *)local_48;
  it.row_begin._M_current =
       (sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
        *)local_10;
  it.row_current._M_current =
       (sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
        *)local_40;
  it.col_current = local_38;
  it_end.row_end._M_current =
       (sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
        *)in_stack_ffffffffffffff98;
  it_end.row_begin._M_current =
       (sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
        *)local_30;
  it_end.row_current._M_current =
       (sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
        *)pdVar1;
  it_end.col_current = in_RSI;
  sparse_hashtable_destructive_iterator<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
  ::sparse_hashtable_destructive_iterator(local_20,local_28,it,it_end);
  return in_RDI;
}

Assistant:

destructive_iterator destructive_begin() {
    return destructive_iterator(this, table.destructive_begin(),
                                table.destructive_end());
  }